

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

bool __thiscall
glslang::TReflection::addStage(TReflection *this,EShLanguage stage,TIntermediate *intermediate)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  long *plVar6;
  TIntermNode **sequnence_1;
  undefined8 *puVar7;
  TIntermNode **sequnence;
  undefined8 *puVar8;
  TReflectionTraverser it;
  TReflectionTraverser local_b0;
  
  bVar3 = false;
  if ((intermediate->treeRoot != (TIntermNode *)0x0) &&
     (bVar3 = false, intermediate->numEntryPoints == 1)) {
    if (intermediate->recursive == false) {
      buildAttributeReflection(this,stage,intermediate);
      TReflectionTraverser::TReflectionTraverser(&local_b0,intermediate,this);
      iVar4 = (*intermediate->treeRoot->_vptr_TIntermNode[6])();
      lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 400))
                        ((long *)CONCAT44(extraout_var,iVar4));
      puVar1 = *(undefined8 **)(lVar5 + 0x10);
      for (puVar8 = *(undefined8 **)(lVar5 + 8); puVar8 != puVar1; puVar8 = puVar8 + 1) {
        lVar5 = (**(code **)(*(long *)*puVar8 + 0x30))();
        if (lVar5 != 0) {
          lVar5 = (**(code **)(*(long *)*puVar8 + 0x30))();
          if (*(int *)(lVar5 + 0xb8) == 3) {
            local_b0.updateStageMasks = false;
            plVar6 = (long *)(**(code **)(*(long *)*puVar8 + 0x30))();
            lVar5 = (**(code **)(*plVar6 + 400))(plVar6);
            puVar2 = *(undefined8 **)(lVar5 + 0x10);
            for (puVar7 = *(undefined8 **)(lVar5 + 8); puVar7 != puVar2; puVar7 = puVar7 + 1) {
              plVar6 = (long *)(**(code **)(*(long *)*puVar7 + 0x60))();
              if (plVar6 == (long *)0x0) goto LAB_00308a7a;
              lVar5 = (**(code **)(*plVar6 + 0x108))(plVar6);
              if (((*(uint *)(lVar5 + 8) & 0x7f) == 5) &&
                 ((this->options & EShReflectionSharedStd140UBO) != EShReflectionDefault)) {
LAB_00308a2f:
                iVar4 = (**(code **)(*plVar6 + 0x100))(plVar6);
                if ((iVar4 == 0x10) &&
                   ((lVar5 = (**(code **)(*plVar6 + 0x108))(plVar6),
                    (*(byte *)(lVar5 + 0x10) & 0xf) == 2 ||
                    (lVar5 = (**(code **)(*plVar6 + 0x108))(plVar6),
                    (*(byte *)(lVar5 + 0x10) & 0xf) == 1)))) {
LAB_00308a6d:
                  (**(code **)(*plVar6 + 0x10))(plVar6,&local_b0);
                }
              }
              else {
                lVar5 = (**(code **)(*plVar6 + 0x108))(plVar6);
                if ((char)this->options < '\0' && (*(uint *)(lVar5 + 8) & 0x7f) == 6)
                goto LAB_00308a2f;
                if ((this->options & EShReflectionAllIOVariables) != EShReflectionDefault) {
                  lVar5 = (**(code **)(*plVar6 + 0x108))(plVar6);
                  if ((0x1b < (*(uint *)(lVar5 + 8) & 0x7f)) ||
                     ((0xe300008U >> (*(uint *)(lVar5 + 8) & 0x1f) & 1) == 0)) {
                    lVar5 = (**(code **)(*plVar6 + 0x108))(plVar6);
                    if ((0x1e < (*(uint *)(lVar5 + 8) & 0x7f)) ||
                       ((0x71c00010U >> (*(uint *)(lVar5 + 8) & 0x1f) & 1) == 0)) goto LAB_00308a7a;
                  }
                  goto LAB_00308a6d;
                }
              }
LAB_00308a7a:
            }
          }
          else {
            local_b0.updateStageMasks = true;
            plVar6 = (long *)(**(code **)(*(long *)*puVar8 + 0x30))();
            (**(code **)(*plVar6 + 0x10))(plVar6,&local_b0);
          }
        }
      }
      local_b0.updateStageMasks = true;
      buildCounterIndices(this,intermediate);
      buildUniformStageMask(this,intermediate);
      TReflectionTraverser::~TReflectionTraverser(&local_b0);
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool TReflection::addStage(EShLanguage stage, const TIntermediate& intermediate)
{
    if (intermediate.getTreeRoot() == nullptr ||
        intermediate.getNumEntryPoints() != 1 ||
        intermediate.isRecursive())
        return false;

    buildAttributeReflection(stage, intermediate);

    TReflectionTraverser it(intermediate, *this);

    for (auto& sequnence : intermediate.getTreeRoot()->getAsAggregate()->getSequence()) {
        if (sequnence->getAsAggregate() != nullptr) {
            if (sequnence->getAsAggregate()->getOp() == glslang::EOpLinkerObjects) {
                it.updateStageMasks = false;
                TIntermAggregate* linkerObjects = sequnence->getAsAggregate();
                for (auto& sequnence : linkerObjects->getSequence()) {
                    auto pNode = sequnence->getAsSymbolNode();
                    if (pNode != nullptr) {
                        if ((pNode->getQualifier().storage == EvqUniform &&
                            (options & EShReflectionSharedStd140UBO)) ||
                           (pNode->getQualifier().storage == EvqBuffer &&
                            (options & EShReflectionSharedStd140SSBO))) {
                            // collect std140 and shared uniform block form AST
                            if ((pNode->getBasicType() == EbtBlock) &&
                                ((pNode->getQualifier().layoutPacking == ElpStd140) ||
                                 (pNode->getQualifier().layoutPacking == ElpShared))) {
                                   pNode->traverse(&it);
                            }
                        }
                        else if ((options & EShReflectionAllIOVariables) &&
                            (pNode->getQualifier().isPipeInput() || pNode->getQualifier().isPipeOutput()))
                        {
                            pNode->traverse(&it);
                        }
                    }
                }
            } else {
                // This traverser will travers all function in AST.
                // If we want reflect uncalled function, we need set linke message EShMsgKeepUncalled.
                // When EShMsgKeepUncalled been set to true, all function will be keep in AST, even it is a uncalled function.
                // This will keep some uniform variables in reflection, if those uniform variables is used in these uncalled function.
                //
                // If we just want reflect only live node, we can use a default link message or set EShMsgKeepUncalled false.
                // When linke message not been set EShMsgKeepUncalled, linker won't keep uncalled function in AST.
                // So, travers all function node can equivalent to travers live function.
                it.updateStageMasks = true;
                sequnence->getAsAggregate()->traverse(&it);
            }
        }
    }
    it.updateStageMasks = true;

    buildCounterIndices(intermediate);
    buildUniformStageMask(intermediate);

    return true;
}